

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  u16 uVar1;
  int iVar2;
  undefined8 *puVar3;
  uint uVar4;
  LookasideSlot *p;
  undefined8 *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  if ((db->lookaside).nOut != 0) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar8 = sz & 0xfffffff8;
  uVar7 = uVar8;
  if ((int)uVar8 < 9) {
    uVar7 = 0;
  }
  uVar4 = cnt;
  if (cnt < 1) {
    uVar4 = 0;
  }
  uVar1 = 0;
  if (cnt < 1 || (int)uVar8 < 9) {
LAB_00153005:
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).pStart = (void *)0x0;
    (db->lookaside).sz = uVar1;
    (db->lookaside).pEnd = (void *)0x0;
    (db->lookaside).bEnabled = '\0';
    bVar9 = false;
  }
  else {
    puVar6 = (undefined8 *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      puVar6 = (undefined8 *)sqlite3Malloc(uVar4 * uVar8);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      uVar1 = (u16)uVar7;
      if (puVar6 == (undefined8 *)0x0) goto LAB_00153005;
      iVar2 = (*sqlite3Config.m.xSize)(puVar6);
      uVar4 = iVar2 / (int)uVar8;
    }
    (db->lookaside).pStart = puVar6;
    (db->lookaside).pFree = (LookasideSlot *)0x0;
    (db->lookaside).sz = (u16)uVar8;
    if (0 < (int)uVar4) {
      uVar4 = uVar4 + 1;
      puVar3 = (undefined8 *)0x0;
      puVar5 = puVar6;
      do {
        *puVar5 = puVar3;
        puVar6 = (undefined8 *)((long)puVar5 + (ulong)uVar8);
        uVar4 = uVar4 - 1;
        puVar3 = puVar5;
        puVar5 = puVar6;
      } while (1 < uVar4);
      (db->lookaside).pFree = (LookasideSlot *)((long)puVar6 - (ulong)uVar8);
    }
    bVar9 = pBuf == (void *)0x0;
    (db->lookaside).pEnd = puVar6;
    (db->lookaside).bEnabled = '\x01';
  }
  (db->lookaside).bMalloced = bVar9;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
  void *pStart;
  if( db->lookaside.nOut ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for 
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( sz*cnt );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) cnt = sqlite3MallocSize(pStart)/sz;
  }else{
    pStart = pBuf;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=cnt-1; i>=0; i--){
      p->pNext = db->lookaside.pFree;
      db->lookaside.pFree = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
    db->lookaside.pEnd = p;
    db->lookaside.bEnabled = 1;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
  }else{
    db->lookaside.pEnd = 0;
    db->lookaside.bEnabled = 0;
    db->lookaside.bMalloced = 0;
  }
  return SQLITE_OK;
}